

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crate-reader.cc
# Opt level: O3

bool __thiscall
tinyusdz::crate::CrateReader::ReadPathListOp(CrateReader *this,ListOp<tinyusdz::Path> *d)

{
  ulong uVar1;
  byte bVar2;
  StreamReader *pSVar3;
  bool bVar4;
  ostream *poVar5;
  ostringstream ss_e;
  long *local_1c8;
  long local_1b8 [2];
  vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> local_1a8 [4];
  ios_base local_138 [272];
  
  pSVar3 = this->_sr;
  uVar1 = pSVar3->idx_ + 1;
  if (pSVar3->length_ < uVar1) {
    ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"[error]",7);
    ::std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,
               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
               ,0x56);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,":",1);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"ReadPathListOp",0xe);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"():",3);
    poVar5 = (ostream *)::std::ostream::operator<<((ostringstream *)local_1a8,0x576);
    ::std::__ostream_insert<char,std::char_traits<char>>(poVar5," ",1);
    ::std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,"Failed to read ListOpHeader.",0x1c);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"\n",1);
    ::std::__cxx11::stringbuf::str();
    ::std::__cxx11::string::_M_append((char *)&this->_err,(ulong)local_1c8);
    if (local_1c8 != local_1b8) {
      operator_delete(local_1c8,local_1b8[0] + 1);
    }
    ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
    ::std::ios_base::~ios_base(local_138);
    return false;
  }
  bVar2 = pSVar3->binary_[pSVar3->idx_];
  pSVar3->idx_ = uVar1;
  if ((bVar2 & 1) != 0) {
    ListOp<tinyusdz::Path>::ClearAndMakeExplicit(d);
  }
  if ((bVar2 & 2) != 0) {
    local_1a8[0].super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_1a8[0].super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_1a8[0].super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    bVar4 = ReadPathListOp::anon_class_8_1_8991fb9c::operator()
                      ((anon_class_8_1_8991fb9c *)this,local_1a8);
    if (!bVar4) goto LAB_001d07a8;
    ::std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::operator=
              (&d->explicit_items,local_1a8);
    ::std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::~vector(local_1a8);
  }
  if ((bVar2 & 4) != 0) {
    local_1a8[0].super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_1a8[0].super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_1a8[0].super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    bVar4 = ReadPathListOp::anon_class_8_1_8991fb9c::operator()
                      ((anon_class_8_1_8991fb9c *)this,local_1a8);
    if (!bVar4) goto LAB_001d07a8;
    ::std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::operator=
              (&d->added_items,local_1a8);
    ::std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::~vector(local_1a8);
  }
  if ((bVar2 & 0x20) != 0) {
    local_1a8[0].super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_1a8[0].super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_1a8[0].super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    bVar4 = ReadPathListOp::anon_class_8_1_8991fb9c::operator()
                      ((anon_class_8_1_8991fb9c *)this,local_1a8);
    if (!bVar4) goto LAB_001d07a8;
    ::std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::operator=
              (&d->prepended_items,local_1a8);
    ::std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::~vector(local_1a8);
  }
  if ((bVar2 & 0x40) != 0) {
    local_1a8[0].super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_1a8[0].super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_1a8[0].super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    bVar4 = ReadPathListOp::anon_class_8_1_8991fb9c::operator()
                      ((anon_class_8_1_8991fb9c *)this,local_1a8);
    if (!bVar4) goto LAB_001d07a8;
    ::std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::operator=
              (&d->appended_items,local_1a8);
    ::std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::~vector(local_1a8);
  }
  if ((bVar2 & 8) != 0) {
    local_1a8[0].super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_1a8[0].super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_1a8[0].super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    bVar4 = ReadPathListOp::anon_class_8_1_8991fb9c::operator()
                      ((anon_class_8_1_8991fb9c *)this,local_1a8);
    if (!bVar4) goto LAB_001d07a8;
    ::std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::operator=
              (&d->deleted_items,local_1a8);
    ::std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::~vector(local_1a8);
  }
  if ((bVar2 & 0x10) == 0) {
    return true;
  }
  local_1a8[0].super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_1a8[0].super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1a8[0].super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  bVar4 = ReadPathListOp::anon_class_8_1_8991fb9c::operator()
                    ((anon_class_8_1_8991fb9c *)this,local_1a8);
  if (bVar4) {
    ::std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::operator=
              (&d->ordered_items,local_1a8);
    ::std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::~vector(local_1a8);
    return true;
  }
LAB_001d07a8:
  ::std::__cxx11::string::append((char *)&this->_err);
  ::std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::~vector(local_1a8);
  return false;
}

Assistant:

bool CrateReader::ReadPathListOp(ListOp<Path> *d) {
  // read ListOpHeader
  ListOpHeader h;
  if (!_sr->read1(&h.bits)) {
    PUSH_ERROR("Failed to read ListOpHeader.");
    return false;
  }

  if (h.IsExplicit()) {
    DCOUT("IsExplicit()");
    d->ClearAndMakeExplicit();
  }

  // array data is not compressed
  auto ReadFn = [this](std::vector<Path> &result) -> bool {
    uint64_t n{0};
    if (!_sr->read8(&n)) {
      PUSH_ERROR_AND_RETURN_TAG(kTag, "Failed to read the number of array elements.");
      return false;
    }

    if (n > _config.maxArrayElements) {
      _err += "Too many ListOp elements.\n";
      return false;
    }

    CHECK_MEMORY_USAGE(size_t(n) * sizeof(crate::Index));

    std::vector<crate::Index> ivalue(static_cast<size_t>(n));

    if (!_sr->read(size_t(n) * sizeof(crate::Index),
                   size_t(n) * sizeof(crate::Index),
                   reinterpret_cast<uint8_t *>(ivalue.data()))) {
      PUSH_ERROR("Failed to read ListOp data..");
      return false;
    }

    // reconstruct
    result.resize(static_cast<size_t>(n));
    for (size_t i = 0; i < n; i++) {
      if (auto pv = GetPath(ivalue[i])) {
        result[i] = pv.value();
      } else {
        PUSH_ERROR("Invalid Index for Path.");
        return false;
      }
    }

    return true;
  };

  if (h.HasExplicitItems()) {
    std::vector<Path> items;
    if (!ReadFn(items)) {
      _err += "Failed to read ListOp::ExplicitItems.\n";
      return false;
    }

    d->SetExplicitItems(items);
  }

  if (h.HasAddedItems()) {
    std::vector<Path> items;
    if (!ReadFn(items)) {
      _err += "Failed to read ListOp::AddedItems.\n";
      return false;
    }

    d->SetAddedItems(items);
  }

  if (h.HasPrependedItems()) {
    std::vector<Path> items;
    if (!ReadFn(items)) {
      _err += "Failed to read ListOp::PrependedItems.\n";
      return false;
    }

    d->SetPrependedItems(items);
  }

  if (h.HasAppendedItems()) {
    std::vector<Path> items;
    if (!ReadFn(items)) {
      _err += "Failed to read ListOp::AppendedItems.\n";
      return false;
    }

    d->SetAppendedItems(items);
  }

  if (h.HasDeletedItems()) {
    std::vector<Path> items;
    if (!ReadFn(items)) {
      _err += "Failed to read ListOp::DeletedItems.\n";
      return false;
    }

    d->SetDeletedItems(items);
  }

  if (h.HasOrderedItems()) {
    std::vector<Path> items;
    if (!ReadFn(items)) {
      _err += "Failed to read ListOp::OrderedItems.\n";
      return false;
    }

    d->SetOrderedItems(items);
  }

  return true;
}